

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.cpp
# Opt level: O2

void test_std_intersect<std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *values)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  clock_t cVar6;
  clock_t cVar7;
  ostream *poVar8;
  pointer pvVar9;
  _Vector_base<long,_std::allocator<long>_> local_58;
  _Vector_base<long,_std::allocator<long>_> local_38;
  
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_58,
             (values->
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  cVar6 = clock();
  pvVar1 = (values->
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (values->
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (pvVar9 = pvVar2 + 1, pvVar9 != pvVar1) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::reserve
              ((vector<long,_std::allocator<long>_> *)&local_38,
               ((long)pvVar2[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) +
               ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3));
    std::
    __set_intersection<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,std::back_insert_iterator<std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58._M_impl.super__Vector_impl_data._M_start,
               local_58._M_impl.super__Vector_impl_data._M_finish,
               (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               pvVar2[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_38);
    plVar5 = local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
    plVar4 = local_38._M_impl.super__Vector_impl_data._M_finish;
    plVar3 = local_38._M_impl.super__Vector_impl_data._M_start;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38._M_impl.super__Vector_impl_data._M_start =
         local_58._M_impl.super__Vector_impl_data._M_start;
    local_38._M_impl.super__Vector_impl_data._M_finish =
         local_58._M_impl.super__Vector_impl_data._M_finish;
    local_58._M_impl.super__Vector_impl_data._M_start = plVar3;
    local_58._M_impl.super__Vector_impl_data._M_finish = plVar4;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = plVar5;
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_38);
    pvVar2 = pvVar9;
  }
  cVar7 = clock();
  poVar8 = std::operator<<((ostream *)&std::cout,"std::set_intersection: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator<<((ostream *)&std::cout,"\t");
  poVar8 = std::ostream::_M_insert<double>((double)(cVar7 - cVar6) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void test_std_intersect (const Container & values)
{
    typename Container::value_type intersected(values.front());

    clock_t intersect_time = clock();
    for (const auto & row: boost::make_iterator_range(std::next(values.begin()), values.end()))
    {
        typename Container::value_type result;
        result.reserve(intersected.size() + row.size());
        std::set_intersection(intersected.begin(), intersected.end(), row.begin(), row.end(), std::back_inserter(result));
        std::swap(result, intersected);
    }
    intersect_time = clock() - intersect_time;

    std::cout << "std::set_intersection: " << intersected.size() << std::endl;
    std::cout << "\t" << static_cast<double>(intersect_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}